

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

ResultValueBase<Catch::clara::detail::ParseState> * __thiscall
Catch::clara::detail::ResultValueBase<Catch::clara::detail::ParseState>::operator=
          (ResultValueBase<Catch::clara::detail::ParseState> *this,
          ResultValueBase<Catch::clara::detail::ParseState> *other)

{
  Type TVar1;
  
  if ((this->super_ResultBase).m_type == Ok) {
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              (&(this->field_0).m_value.m_remainingTokens.m_tokenBuffer);
  }
  TVar1 = (other->super_ResultBase).m_type;
  (this->super_ResultBase).m_type = TVar1;
  if (TVar1 == Ok) {
    ParseState::ParseState(&(this->field_0).m_value,&(other->field_0).m_value);
  }
  return this;
}

Assistant:

auto operator=( ResultValueBase const &other ) -> ResultValueBase & {
            if( m_type == ResultBase::Ok )
                m_value.~T();
            ResultBase::operator=(other);
            if( m_type == ResultBase::Ok )
                new( &m_value ) T( other.m_value );
            return *this;
        }